

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O3

void Msat_ClauseWriteDimacs(FILE *pFile,Msat_Clause_t *pC,int fIncrement)

{
  char *pcVar1;
  ulong uVar2;
  
  if ((*(uint *)&pC->field_0x4 & 0x1fff8) != 0) {
    uVar2 = 0;
    do {
      pcVar1 = "-";
      if (((&pC[1].Num)[uVar2] & 1U) == 0) {
        pcVar1 = "";
      }
      fprintf((FILE *)pFile,"%s%d ",pcVar1,(ulong)((&pC[1].Num)[uVar2] / 2 + (uint)(0 < fIncrement))
             );
      uVar2 = uVar2 + 1;
    } while (uVar2 < (*(uint *)&pC->field_0x4 >> 3 & 0x3fff));
  }
  if (fIncrement != 0) {
    fputc(0x30,(FILE *)pFile);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Msat_ClauseWriteDimacs( FILE * pFile, Msat_Clause_t * pC, int  fIncrement )
{
    int i;
    for ( i = 0; i < (int)pC->nSize; i++ )
        fprintf( pFile, "%s%d ", ((pC->pData[i]&1)? "-": ""),  pC->pData[i]/2 + (int)(fIncrement>0) );
    if ( fIncrement )
        fprintf( pFile, "0" );
    fprintf( pFile, "\n" );
}